

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

ssize_t __thiscall r_code::SysObject::read(SysObject *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *puVar1;
  iterator __position;
  iterator iVar2;
  vector<r_code::Atom,std::allocator<r_code::Atom>> *pvVar3;
  uint32_t *puVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  SysView *this_00;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Atom local_5c;
  ulong local_58;
  vector<r_code::Atom,std::allocator<r_code::Atom>> *local_50;
  ulong local_48;
  uint local_40;
  uint local_3c;
  uint32_t *local_38;
  
  local_38 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  this->oid = *local_38;
  uVar6 = (ulong)local_38[1];
  local_58 = (ulong)local_38[2];
  puVar1 = local_38 + 5;
  uVar5 = (ulong)local_38[3];
  uVar8 = (ulong)local_38[4];
  local_48 = uVar5;
  if (uVar6 != 0) {
    local_50 = (vector<r_code::Atom,std::allocator<r_code::Atom>> *)&(this->super_ImageObject).code;
    uVar10 = 0;
    do {
      Atom::Atom(&local_5c,puVar1[uVar10]);
      __position._M_current =
           (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ImageObject).code.m_vector.
          super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<r_code::Atom,std::allocator<r_code::Atom>>::
        _M_realloc_insert<r_code::Atom_const&>(local_50,__position,&local_5c);
      }
      else {
        (__position._M_current)->atom = local_5c.atom;
        (this->super_ImageObject).code.m_vector.
        super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      Atom::~Atom(&local_5c);
      uVar10 = uVar10 + 1;
      uVar5 = extraout_RAX;
    } while (uVar6 != uVar10);
  }
  puVar4 = local_38;
  local_50 = (vector<r_code::Atom,std::allocator<r_code::Atom>> *)puVar1;
  if (local_58 != 0) {
    uVar10 = 0;
    do {
      local_40 = puVar4[uVar6 + uVar10 + 5];
      uVar5 = (ulong)local_40;
      iVar2._M_current =
           (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->super_ImageObject).references.m_vector.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(this->super_ImageObject).references,iVar2,&local_40);
        uVar5 = extraout_RAX_00;
      }
      else {
        *iVar2._M_current = local_40;
        (this->super_ImageObject).references.m_vector.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar10 = uVar10 + 1;
    } while (local_58 != uVar10);
  }
  puVar1 = local_38;
  uVar10 = local_58;
  if (local_48 != 0) {
    uVar9 = 0;
    do {
      local_3c = puVar1[uVar6 + uVar10 + uVar9 + 5];
      uVar5 = (ulong)local_3c;
      iVar2._M_current =
           (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->markers,iVar2,
                   &local_3c);
        uVar5 = extraout_RAX_01;
      }
      else {
        *iVar2._M_current = local_3c;
        (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar9 = uVar9 + 1;
    } while (local_48 != uVar9);
  }
  uVar9 = local_48;
  pvVar3 = local_50;
  uVar10 = local_58;
  if (uVar8 != 0) {
    lVar7 = 0;
    do {
      this_00 = (SysView *)operator_new(0x38);
      SysView::SysView(this_00);
      (*(this_00->super_ImageObject)._vptr_ImageObject[3])
                (this_00,(uint32_t *)((long)pvVar3 + (uVar6 + uVar10 + uVar9 + lVar7) * 4));
      vector<r_code::SysView_*>::push_back(&this->views,this_00);
      uVar5 = ((long)(this_00->super_ImageObject).code.m_vector.
                     super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_00->super_ImageObject).code.m_vector.
                     super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + lVar7;
      lVar7 = ((long)(this_00->super_ImageObject).references.m_vector.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_00->super_ImageObject).references.m_vector.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + uVar5 + 2;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return uVar5;
}

Assistant:

void SysObject::read(uint32_t *data)
{
    oid = data[0];
    size_t code_size = data[1];
    size_t reference_set_size = data[2];
    size_t marker_set_size = data[3];
    size_t view_set_size = data[4];
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[5 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[5 + i + j]);
    }

    for (k = 0; k < marker_set_size; ++k) {
        markers.push_back(data[5 + i + j + k]);
    }

    size_t offset = 0;

    for (l = 0; l < view_set_size; ++l) {
        SysView *v = new SysView();
        v->read(data + 5 + i + j + k + offset);
        views.push_back(v);
        offset += v->get_size();
    }
}